

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O2

shared_ptr<BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVectorForClusteredBG>_> * __thiscall
boost::shared_ptr<BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVectorForClusteredBG>_>::
operator=(shared_ptr<BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVectorForClusteredBG>_>
          *this,shared_ptr<BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVectorForClusteredBG>_>
                *r)

{
  int *piVar1;
  sp_counted_base *psVar2;
  element_type *peVar3;
  sp_counted_base *psVar4;
  shared_count sStack_10;
  
  peVar3 = r->px;
  psVar4 = (r->pn).pi_;
  psVar2 = (r->pn).pi_;
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    piVar1 = &psVar2->use_count_;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  sStack_10.pi_ = (this->pn).pi_;
  this->px = peVar3;
  (this->pn).pi_ = psVar4;
  detail::shared_count::~shared_count(&sStack_10);
  return this;
}

Assistant:

shared_ptr & operator=( shared_ptr const & r ) BOOST_NOEXCEPT
    {
        this_type(r).swap(*this);
        return *this;
    }